

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O1

void __thiscall
TPZMatrixSolver<Fad<float>_>::TPZMatrixSolver
          (TPZMatrixSolver<Fad<float>_> *this,void **vtt,TPZMatrixSolver<Fad<float>_> *Source)

{
  TPZReference *pTVar1;
  
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[2];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)vtt[1];
  (this->super_TPZSolver).super_TPZSavable._vptr_TPZSavable = (_func_int **)*vtt;
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZMatrix<Fad<float>_> *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fReferenceMatrix).fRef = pTVar1;
  (this->fScratch).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fRow = 0;
  (this->fScratch).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fCol = 0;
  (this->fScratch).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  (this->fScratch).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.fDefPositive = '\0';
  (this->fScratch).super_TPZMatrix<Fad<float>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_01846300;
  (this->fScratch).fElem = (Fad<float> *)0x0;
  (this->fScratch).fGiven = (Fad<float> *)0x0;
  (this->fScratch).fSize = 0;
  TPZVec<int>::TPZVec(&(this->fScratch).fPivot.super_TPZVec<int>,0);
  (this->fScratch).fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8
  ;
  (this->fScratch).fPivot.super_TPZVec<int>.fStore = (this->fScratch).fPivot.fExtAlloc;
  (this->fScratch).fPivot.super_TPZVec<int>.fNElements = 0;
  (this->fScratch).fPivot.super_TPZVec<int>.fNAlloc = 0;
  (this->fScratch).fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_018465f0;
  (this->fScratch).fWork.fStore = (Fad<float> *)0x0;
  (this->fScratch).fWork.fNElements = 0;
  (this->fScratch).fWork.fNAlloc = 0;
  pTVar1 = (TPZReference *)operator_new(0x10);
  pTVar1->fPointer = (TPZMatrix<Fad<float>_> *)0x0;
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 0;
  LOCK();
  (pTVar1->fCounter).super___atomic_base<int>._M_i = 1;
  UNLOCK();
  (this->fContainer).fRef = pTVar1;
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=
            (&this->fReferenceMatrix,&Source->fReferenceMatrix);
  TPZAutoPointer<TPZMatrix<Fad<float>_>_>::operator=(&this->fContainer,&Source->fContainer);
  return;
}

Assistant:

TPZMatrixSolver<TVar>::TPZMatrixSolver(const TPZMatrixSolver<TVar> &Source) :
fScratch()
{
	fReferenceMatrix = Source.fReferenceMatrix;
	fContainer = Source.fContainer;
}